

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O2

int amrex::parser_ast_depth(parser_node *node)

{
  int iVar1;
  int iVar2;
  int iVar3;
  initializer_list<int> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  iVar3 = 0;
LAB_006c935d:
  iVar3 = iVar3 + 1;
  switch(node->type) {
  case PARSER_NUMBER:
  case PARSER_SYMBOL:
  case PARSER_ADD_VP:
  case PARSER_ADD_PP:
  case PARSER_SUB_VP:
  case PARSER_SUB_PP:
  case PARSER_MUL_VP:
  case PARSER_MUL_PP:
  case PARSER_DIV_VP:
  case PARSER_DIV_PP:
  case PARSER_NEG_P:
    iVar2 = 1;
LAB_006c937c:
    return iVar2 + iVar3 + -1;
  case PARSER_ADD:
  case PARSER_SUB:
  case PARSER_MUL:
  case PARSER_DIV:
  case PARSER_F2:
  case PARSER_LIST:
    iVar1 = parser_ast_depth(node->l);
    iVar2 = parser_ast_depth(node->r);
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    break;
  case PARSER_NEG:
  case PARSER_F1:
    goto switchD_006c9371_caseD_7;
  case PARSER_F3:
    iVar2 = parser_ast_depth(node->l);
    iVar1 = parser_ast_depth(node->r);
    local_60._M_string_length._0_4_ = parser_ast_depth((node->lvp).n);
    __l._M_len = 3;
    __l._M_array = (iterator)&local_60;
    local_60._M_dataplus._M_p._0_4_ = iVar2;
    local_60._M_dataplus._M_p._4_4_ = iVar1;
    iVar2 = std::max<int>(__l);
    break;
  case PARSER_ASSIGN:
    iVar2 = parser_ast_depth(node->r);
    break;
  default:
    std::__cxx11::to_string(&local_40,node->type);
    std::operator+(&local_60,"parser_ast_print: unknown node type ",&local_40);
    Abort(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    iVar2 = 0;
    goto LAB_006c937c;
  }
  return iVar2 + iVar3;
switchD_006c9371_caseD_7:
  node = node->l;
  goto LAB_006c935d;
}

Assistant:

int
parser_ast_depth (struct parser_node* node)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
    case PARSER_SYMBOL:
        return 1;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_LIST:
    {
        int d1 = parser_ast_depth(node->l);
        int d2 = parser_ast_depth(node->r);
        return std::max(d1,d2)+1;
    }
    case PARSER_NEG:
        return parser_ast_depth(node->l)+1;
    case PARSER_F1:
        return parser_ast_depth(((struct parser_f1*)node)->l) + 1;
    case PARSER_F2:
    {
        int d1 = parser_ast_depth(((struct parser_f2*)node)->l);
        int d2 = parser_ast_depth(((struct parser_f2*)node)->r);
        return std::max(d1,d2)+1;
    }
    case PARSER_F3:
    {
        int d1 = parser_ast_depth(((struct parser_f3*)node)->n1);
        int d2 = parser_ast_depth(((struct parser_f3*)node)->n2);
        int d3 = parser_ast_depth(((struct parser_f3*)node)->n3);
        return std::max({d1,d2,d3})+1;
    }
    case PARSER_ASSIGN:
    {
        int d = parser_ast_depth(((struct parser_assign*)node)->v);
        return d+1;
    }
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
    case PARSER_NEG_P:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
        return 1;
    default:
        amrex::Abort("parser_ast_print: unknown node type " + std::to_string(node->type));
        return 0;
    }
}